

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_add_constrain_midnode
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_DBL node1_weight,REF_INT new_node)

{
  int iVar1;
  REF_GEOM ref_geom;
  REF_INT *pRVar2;
  REF_NODE ref_node;
  REF_INT id;
  undefined4 uVar3;
  undefined4 uVar4;
  REF_STATUS ref_private_macro_code_rss;
  uint uVar5;
  uint uVar6;
  undefined4 in_register_0000000c;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  REF_INT node;
  REF_CELL pRVar10;
  bool bVar11;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  REF_INT sense;
  REF_INT ncell;
  REF_INT cell;
  REF_INT geom1;
  REF_INT geom0;
  REF_INT face_geom;
  REF_BOOL supported;
  REF_DBL param1 [2];
  REF_DBL param0 [2];
  REF_INT cells [2];
  REF_INT nodes [27];
  REF_INT local_154;
  int local_150;
  REF_INT local_14c;
  long local_148;
  undefined8 local_140;
  REF_NODE local_138;
  REF_INT local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  double local_118;
  double dStack_110;
  undefined1 local_108 [12];
  undefined4 uStack_fc;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  long local_c0;
  REF_CELL local_b8;
  REF_INT local_b0 [32];
  
  local_140 = CONCAT44(in_register_0000000c,new_node);
  ref_geom = ref_grid->geom;
  if ((node0 < 0) || (ref_geom->ref_adj->nnode <= node0)) {
    bVar11 = false;
  }
  else {
    bVar11 = ref_geom->ref_adj->first[(uint)node0] != -1;
  }
  if (node1 < 0) {
    return 0;
  }
  if (ref_geom->ref_adj->nnode <= node1) {
    return 0;
  }
  if (!(bool)(bVar11 & ref_geom->ref_adj->first[(uint)node1] != -1)) {
    return 0;
  }
  local_138 = ref_grid->node;
  local_108._8_4_ = in_XMM0_Dc;
  local_108._0_8_ = node1_weight;
  uStack_fc = in_XMM0_Dd;
  local_118 = 1.0 - node1_weight;
  dStack_110 = 0.0;
  pRVar10 = ref_grid->cell[0];
  local_b0[2] = node0;
  local_b0[3] = node1;
  uVar5 = ref_cell_with(pRVar10,local_b0 + 2,&local_14c);
  if (uVar5 == 5) {
LAB_00152298:
    pRVar10 = ref_grid->cell[3];
    uVar6 = ref_cell_list_with2(pRVar10,node0,node1,2,&local_150,local_b0);
    if (uVar6 != 0) {
      pcVar9 = "list";
      uVar7 = 0x56c;
LAB_001522e7:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar7,
             "ref_geom_add_constrain_midnode",(ulong)uVar6,pcVar9);
      return uVar6;
    }
    if ((long)local_150 == 0) {
      return 0;
    }
    if ((local_150 != 2) && (ref_geom->manifold != 0)) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x576,
             "ref_geom_add_constrain_midnode","expected two tri for between",2,(long)local_150);
      ref_geom_tattle(ref_geom,node0);
      ref_geom_tattle(ref_geom,node1);
      ref_node = local_138;
      ref_node_location(local_138,node0);
      ref_node_location(ref_node,node1);
      return 1;
    }
    if (local_150 < 1) {
      return 0;
    }
    dStack_110 = local_118;
    uVar3 = local_108._0_4_;
    uVar4 = local_108._4_4_;
    local_108._8_4_ = uVar3;
    uStack_fc = uVar4;
    local_148 = 0;
    local_c0 = (long)((int)local_140 * 0xf) << 3;
    local_b8 = pRVar10;
    while( true ) {
      local_14c = local_b0[local_148];
      uVar6 = ref_cell_nodes(pRVar10,local_14c,local_b0 + 2);
      if (uVar6 != 0) break;
      uVar6 = ref_geom_tri_supported(ref_geom,local_b0 + 2,&local_11c);
      if (uVar6 != 0) {
        uVar8 = (ulong)uVar6;
        pcVar9 = "tri support";
        uVar7 = 0x57c;
        goto LAB_00152938;
      }
      if (local_11c != 0) {
        local_12c = local_b0[(long)pRVar10->node_per + 2];
        uVar6 = ref_geom_cell_tuv(ref_geom,node0,local_b0 + 2,2,&local_d8,&local_154);
        if (uVar6 == 0) {
          uVar6 = ref_geom_cell_tuv(ref_geom,node1,local_b0 + 2,2,&local_e8,&local_154);
          id = local_12c;
          if (uVar6 == 0) {
            local_f8 = local_d8 * local_118 + local_e8 * (double)local_108._0_8_;
            dStack_f0 = dStack_d0 * dStack_110 + dStack_e0 * stack0xffffffffffffff00;
            node = (REF_INT)local_140;
            uVar6 = ref_geom_add(ref_geom,node,2,local_12c,&local_f8);
            if (uVar6 == 0) {
              uVar6 = ref_geom_find(ref_geom,node,2,id,&local_120);
              if (uVar6 == 0) {
                uVar6 = ref_geom_find(ref_geom,node0,2,id,&local_124);
                if (uVar6 == 0) {
                  uVar6 = ref_geom_find(ref_geom,node1,2,id,&local_128);
                  pRVar10 = local_b8;
                  if (uVar6 == 0) {
                    pRVar2 = ref_geom->descr;
                    iVar1 = pRVar2[(long)local_124 * 6 + 3];
                    if ((iVar1 != 0) && (iVar1 == pRVar2[(long)local_128 * 6 + 3])) {
                      pRVar2[(long)local_120 * 6 + 3] = iVar1;
                    }
                    if ((uVar5 != 5) ||
                       (uVar6 = ref_egads_eval_at(ref_geom,2,id,&local_f8,
                                                  (REF_DBL *)((long)local_138->real + local_c0),
                                                  (REF_DBL *)0x0), uVar6 == 0)) goto LAB_00152691;
                    uVar8 = (ulong)uVar6;
                    pcVar9 = "eval";
                    uVar7 = 0x596;
                  }
                  else {
                    uVar8 = (ulong)uVar6;
                    pcVar9 = "face geom";
                    uVar7 = 0x58d;
                  }
                }
                else {
                  uVar8 = (ulong)uVar6;
                  pcVar9 = "face geom";
                  uVar7 = 0x58c;
                }
              }
              else {
                uVar8 = (ulong)uVar6;
                pcVar9 = "new face geom";
                uVar7 = 0x58a;
              }
            }
            else {
              uVar8 = (ulong)uVar6;
              pcVar9 = "new geom";
              uVar7 = 0x588;
            }
          }
          else {
            uVar8 = (ulong)uVar6;
            pcVar9 = "cell uv";
            uVar7 = 0x584;
          }
        }
        else {
          uVar8 = (ulong)uVar6;
          pcVar9 = "cell uv";
          uVar7 = 0x582;
        }
        goto LAB_00152938;
      }
LAB_00152691:
      local_148 = local_148 + 1;
      if (local_150 <= local_148) {
        return 0;
      }
    }
    uVar8 = (ulong)uVar6;
    pcVar9 = "get id";
    uVar7 = 0x57a;
LAB_00152938:
    uVar6 = (uint)uVar8;
  }
  else {
    if (uVar5 == 0) {
      uVar6 = ref_cell_nodes(pRVar10,local_14c,local_b0 + 2);
      if (uVar6 == 0) {
        local_148 = CONCAT44(local_148._4_4_,local_b0[(long)pRVar10->node_per + 2]);
        uVar6 = ref_geom_cell_tuv(ref_geom,node0,local_b0 + 2,1,&local_d8,&local_154);
        if (uVar6 != 0) {
          pcVar9 = "cell uv";
          uVar7 = 0x55f;
          goto LAB_001522e7;
        }
        uVar6 = ref_geom_cell_tuv(ref_geom,node1,local_b0 + 2,1,&local_e8,&local_154);
        if (uVar6 != 0) {
          pcVar9 = "cell uv";
          uVar7 = 0x561;
          goto LAB_001522e7;
        }
        local_f8 = local_d8 * local_118 + local_e8 * (double)local_108._0_8_;
        uVar6 = ref_egads_eval_at(ref_geom,1,(REF_INT)local_148,&local_f8,
                                  local_138->real + (int)local_140 * 0xf,(REF_DBL *)0x0);
        if (uVar6 != 0) {
          pcVar9 = "eval";
          uVar7 = 0x565;
          goto LAB_001522e7;
        }
        uVar6 = ref_geom_add(ref_geom,(REF_INT)local_140,1,(REF_INT)local_148,&local_f8);
        if (uVar6 != 0) {
          pcVar9 = "new geom";
          uVar7 = 0x566;
          goto LAB_001522e7;
        }
        goto LAB_00152298;
      }
      pcVar9 = "get id";
      uVar7 = 0x55b;
    }
    else {
      pcVar9 = "search for edg";
      uVar7 = 0x55a;
      uVar6 = uVar5;
    }
    uVar8 = (ulong)uVar6;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar7,
         "ref_geom_add_constrain_midnode",uVar8,pcVar9);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add_constrain_midnode(REF_GRID ref_grid,
                                                  REF_INT node0, REF_INT node1,
                                                  REF_DBL node1_weight,
                                                  REF_INT new_node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT type, id;
  REF_DBL param[2], param0[2], param1[2];
  REF_BOOL has_edge_support, supported;
  REF_INT sense, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_STATUS status;
  REF_INT i, ncell, cells[2];
  REF_INT face_geom, geom0, geom1;
  REF_BOOL support0, support1;
  REF_DBL node0_weight = 1.0 - node1_weight;

  RSS(ref_geom_supported(ref_geom, node0, &support0), "node0 supported");
  RSS(ref_geom_supported(ref_geom, node1, &support1), "node1 supported");
  if (!support0 || !support1) {
    return REF_SUCCESS;
  }

  /* insert edge geom on edge cell if present */
  nodes[0] = node0;
  nodes[1] = node1;
  ref_cell = ref_grid_edg(ref_grid);
  status = ref_cell_with(ref_cell, nodes, &cell);
  if (REF_NOT_FOUND == status) {
    has_edge_support = REF_FALSE;
  } else {
    RSS(status, "search for edg");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");
    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_EDGE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    RSS(ref_egads_eval_at(ref_geom, type, id, param,
                          ref_node_xyz_ptr(ref_node, new_node), NULL),
        "eval");
    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    has_edge_support = REF_TRUE;
  }

  /* insert face between */
  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  if (0 == ncell) { /* volume edge */
    return REF_SUCCESS;
  }
  if (ref_geom_manifold(ref_geom)) {
    REIB(2, ncell, "expected two tri for between", {
      ref_geom_tattle(ref_geom, node0);
      ref_geom_tattle(ref_geom, node1);
      ref_node_location(ref_node, node0);
      ref_node_location(ref_node, node1);
    });
  }
  for (i = 0; i < ncell; i++) {
    cell = cells[i];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get id");

    RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
    if (!supported) continue; /* no geom support, skip */

    id = nodes[ref_cell_node_per(ref_cell)];
    type = REF_GEOM_FACE;
    RSS(ref_geom_cell_tuv(ref_geom, node0, nodes, type, param0, &sense),
        "cell uv");
    RSS(ref_geom_cell_tuv(ref_geom, node1, nodes, type, param1, &sense),
        "cell uv");
    param[0] = node0_weight * param0[0] + node1_weight * param1[0];
    param[1] = node0_weight * param0[1] + node1_weight * param1[1];

    RSS(ref_geom_add(ref_geom, new_node, type, id, param), "new geom");
    RSS(ref_geom_find(ref_geom, new_node, type, id, &face_geom),
        "new face geom");

    RSS(ref_geom_find(ref_geom, node0, type, id, &geom0), "face geom");
    RSS(ref_geom_find(ref_geom, node1, type, id, &geom1), "face geom");
    if (0 != ref_geom_jump(ref_geom, geom0) &&
        0 != ref_geom_jump(ref_geom, geom1) &&
        ref_geom_jump(ref_geom, geom0) == ref_geom_jump(ref_geom, geom1)) {
      ref_geom_jump(ref_geom, face_geom) = ref_geom_jump(ref_geom, geom0);
    }
    if (!has_edge_support) {
      RSS(ref_egads_eval_at(ref_geom, type, id, param,
                            ref_node_xyz_ptr(ref_node, new_node), NULL),
          "eval");
    }
  }

  return REF_SUCCESS;
}